

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructorCache.cpp
# Opt level: O0

void __thiscall Js::ConstructorCache::UpdateInlineSlotCount(ConstructorCache *this)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  int iVar4;
  undefined4 *puVar5;
  DynamicType **ppDVar6;
  DynamicTypeHandler *this_00;
  DynamicTypeHandler *typeHandler;
  DynamicType *type;
  ConstructorCache *this_local;
  
  bVar2 = IsConsistent(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x71,"(IsConsistent())","IsConsistent()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((this->content).field_0x14 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x72,"(this->content.isPopulated)","this->content.isPopulated");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = IsEnabled(this);
  if (!bVar2) {
    bVar2 = NeedsTypeUpdate(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                  ,0x73,"(IsEnabled() || NeedsTypeUpdate())",
                                  "IsEnabled() || NeedsTypeUpdate()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  if (((byte)(this->content).field_0x14 >> 2 & 1) == 0) {
    typeHandler = (DynamicTypeHandler *)PropertyGuard::GetValue(&this->super_PropertyGuard);
  }
  else {
    ppDVar6 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                        ((WriteBarrierPtr *)&(this->content).pendingType);
    typeHandler = (DynamicTypeHandler *)*ppDVar6;
  }
  this_00 = DynamicType::GetTypeHandler((DynamicType *)typeHandler);
  uVar3 = DynamicTypeHandler::GetInlineSlotCapacity(this_00);
  if ((int)(this->content).inlineSlotCount < (int)(uint)uVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x7f,
                                "(typeHandler->GetInlineSlotCapacity() <= this->content.inlineSlotCount)"
                                ,
                                "typeHandler->GetInlineSlotCapacity() <= this->content.inlineSlotCount"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  iVar4 = DynamicTypeHandler::GetSlotCapacity(this_00);
  if ((this->content).slotCount < iVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x81,"(typeHandler->GetSlotCapacity() <= this->content.slotCount)",
                                "typeHandler->GetSlotCapacity() <= this->content.slotCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  iVar4 = DynamicTypeHandler::GetSlotCapacity(this_00);
  (this->content).slotCount = iVar4;
  uVar3 = DynamicTypeHandler::GetInlineSlotCapacity(this_00);
  (this->content).inlineSlotCount = uVar3;
  bVar2 = IsConsistent(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x84,"(IsConsistent())","IsConsistent()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  return;
}

Assistant:

void ConstructorCache::UpdateInlineSlotCount()
    {
        Assert(IsConsistent());
        Assert(this->content.isPopulated);
        Assert(IsEnabled() || NeedsTypeUpdate());
        DynamicType* type;
        if (this->content.typeUpdatePending)
        {
            type = this->content.pendingType;
        }
        else
        {
            type = reinterpret_cast<DynamicType*>(this->GetValue());
        }
        DynamicTypeHandler* typeHandler = type->GetTypeHandler();
        // Inline slot capacity should never grow as a result of shrinking.
        Assert(typeHandler->GetInlineSlotCapacity() <= this->content.inlineSlotCount);
        // Slot capacity should never grow as a result of shrinking.
        Assert(typeHandler->GetSlotCapacity() <= this->content.slotCount);
        this->content.slotCount = typeHandler->GetSlotCapacity();
        this->content.inlineSlotCount = typeHandler->GetInlineSlotCapacity();
        Assert(IsConsistent());
    }